

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_kmgmt.c
# Opt level: O0

int dh_gen_set_template(void *genctx,void *templ)

{
  int iVar1;
  FFC_PARAMS *pFVar2;
  DH *in_RSI;
  long in_RDI;
  DH *dh;
  dh_gen_ctx *gctx;
  undefined4 local_4;
  
  iVar1 = ossl_prov_is_running();
  if (((iVar1 == 0) || (in_RDI == 0)) || (in_RSI == (DH *)0x0)) {
    local_4 = 0;
  }
  else {
    pFVar2 = ossl_dh_get0_params(in_RSI);
    *(FFC_PARAMS **)(in_RDI + 8) = pFVar2;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int dh_gen_set_template(void *genctx, void *templ)
{
    struct dh_gen_ctx *gctx = genctx;
    DH *dh = templ;

    if (!ossl_prov_is_running() || gctx == NULL || dh == NULL)
        return 0;
    gctx->ffc_params = ossl_dh_get0_params(dh);
    return 1;
}